

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::IfStmt::remove_stmt(IfStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  element_type *peVar1;
  __shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  element_type *peVar4;
  
  peVar4 = (this->then_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar1 = (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar3 = (peVar4->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (psVar3 != (peVar4->super_StmtBlock).stmts_.
                   super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var2 = &psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
    psVar3 = psVar3 + 1;
    if (p_Var2->_M_ptr == peVar1) goto LAB_00189624;
  }
  peVar4 = (this->else_body_).
           super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar3 = (peVar4->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (psVar3 == (peVar4->super_StmtBlock).stmts_.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    p_Var2 = &psVar3->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
    psVar3 = psVar3 + 1;
  } while (p_Var2->_M_ptr != peVar1);
LAB_00189624:
  (*(peVar4->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[10])();
  return;
}

Assistant:

void IfStmt::remove_stmt(const std::shared_ptr<kratos::Stmt> &stmt) {
    for (auto const &s : *then_body_) {
        if (s == stmt) {
            remove_then_stmt(stmt);
            return;
        }
    }
    for (auto const &s : *else_body_) {
        if (s == stmt) {
            remove_else_stmt(stmt);
            return;
        }
    }
}